

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-reconstruct.cc
# Opt level: O1

bool tinyusdz::prim::ReconstructPrim<tinyusdz::CylinderLight>
               (Specifier *spec,PropertyMap *properties,ReferenceList *references,
               CylinderLight *light,string *warn,string *err,PrimReconstructOptions *options)

{
  Property *prop;
  size_type *psVar1;
  _Rb_tree_node_base *__k;
  size_type *psVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  uint uVar4;
  bool bVar5;
  int iVar6;
  undefined7 extraout_var;
  ostream *poVar7;
  long *plVar8;
  const_iterator cVar9;
  mapped_type *pmVar10;
  _Rb_tree_node_base *p_Var11;
  Property *args;
  char *pcVar12;
  char *pcVar13;
  string *psVar14;
  ParseResult ret;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  table;
  ostringstream ss_e;
  undefined1 local_338 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_320;
  string local_310;
  string *local_2f0;
  long *local_2e8 [2];
  long local_2d8 [2];
  TypedAttributeWithFallback<tinyusdz::Purpose> *local_2c8;
  TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::Visibility>_> *local_2c0;
  undefined8 local_2b8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2b0;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
  *local_280;
  TypedAttribute<tinyusdz::Animatable<tinyusdz::Extent>_> *local_278;
  TypedAttributeWithFallback<tinyusdz::Animatable<float>_> *local_270;
  TypedAttributeWithFallback<tinyusdz::Animatable<float>_> *local_268;
  _Rb_tree_node_base *local_260;
  undefined1 local_258 [16];
  code *local_248;
  code *pcStack_240;
  ios_base local_1e8 [272];
  string local_d8;
  string local_b8;
  string local_98;
  _Any_data local_78;
  code *local_68;
  code *pcStack_60;
  _Any_data local_58;
  code *local_48;
  code *pcStack_40;
  
  local_2b0._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_2b0._M_impl.super__Rb_tree_header._M_header;
  local_2b0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_2b0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_2b8 = 0;
  local_2b0._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_2f0 = warn;
  local_2b0._M_impl.super__Rb_tree_header._M_header._M_right =
       local_2b0._M_impl.super__Rb_tree_header._M_header._M_left;
  bVar5 = ReconstructXformOpsFromProperties
                    (spec,(set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&local_2b0,
                     (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                      *)properties,
                     (vector<tinyusdz::XformOp,_std::allocator<tinyusdz::XformOp>_> *)light,err);
  if (bVar5) {
    p_Var11 = (properties->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
    local_260 = &(properties->_M_t)._M_impl.super__Rb_tree_header._M_header;
    local_2b8 = CONCAT71(extraout_var,p_Var11 == local_260);
    if (p_Var11 != local_260) {
      local_268 = &light->length;
      local_270 = &light->radius;
      local_278 = &(light->super_BoundableLight).extent;
      local_280 = &(light->super_BoundableLight).props;
      local_2c8 = &(light->super_BoundableLight).purpose;
      local_2c0 = &(light->super_BoundableLight).visibility;
      do {
        local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_98,*(long *)(p_Var11 + 1),
                   (long)&(p_Var11[1]._M_parent)->_M_color + *(long *)(p_Var11 + 1));
        prop = (Property *)(p_Var11 + 2);
        local_258._0_8_ = &local_248;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)local_258,"inputs:length","");
        psVar14 = (string *)local_258;
        anon_unknown_0::ParseTypedAttribute<float>
                  ((ParseResult *)local_338,
                   (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_2b0,&local_98,prop,(string *)local_258,local_268);
        if ((code **)local_258._0_8_ != &local_248) {
          operator_delete((void *)local_258._0_8_,(ulong)((long)local_248 + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p != &local_98.field_2) {
          operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
        }
        iVar6 = 0;
        if ((local_338._0_8_ & 0xfffffffd) == 0) {
          iVar6 = 3;
LAB_00209b8a:
          bVar5 = false;
        }
        else {
          bVar5 = true;
          if (local_338._0_4_ != Unmatched) {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_258);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_258,"[error]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_258,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                       ,0x5a);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_258,":",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_258,"ReconstructPrim",0xf);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_258,"():",3);
            poVar7 = (ostream *)::std::ostream::operator<<((string *)local_258,0xcfb);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
            local_2e8[0] = local_2d8;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_2e8,"Parsing attribute `{}` failed. Error: {}","");
            fmt::format<char[14],std::__cxx11::string>
                      (&local_310,(fmt *)local_2e8,(string *)"inputs:length",
                       (char (*) [14])(local_338 + 8),psVar14);
            poVar7 = ::std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)local_258,local_310._M_dataplus._M_p,
                                local_310._M_string_length);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
            paVar3 = &local_310.field_2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_310._M_dataplus._M_p != paVar3) {
              operator_delete(local_310._M_dataplus._M_p,local_310.field_2._M_allocated_capacity + 1
                             );
            }
            if (local_2e8[0] != local_2d8) {
              operator_delete(local_2e8[0],local_2d8[0] + 1);
            }
            if (err != (string *)0x0) {
              ::std::__cxx11::stringbuf::str();
              plVar8 = (long *)::std::__cxx11::string::_M_append
                                         ((char *)local_2e8,(ulong)(err->_M_dataplus)._M_p);
              psVar1 = (size_type *)(plVar8 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar8 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar1) {
                local_310.field_2._M_allocated_capacity = *psVar1;
                local_310.field_2._8_8_ = plVar8[3];
                local_310._M_dataplus._M_p = (pointer)paVar3;
              }
              else {
                local_310.field_2._M_allocated_capacity = *psVar1;
                local_310._M_dataplus._M_p = (pointer)*plVar8;
              }
              local_310._M_string_length = plVar8[1];
              *plVar8 = (long)psVar1;
              plVar8[1] = 0;
              *(undefined1 *)(plVar8 + 2) = 0;
              ::std::__cxx11::string::operator=((string *)err,(string *)&local_310);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_310._M_dataplus._M_p != paVar3) {
                operator_delete(local_310._M_dataplus._M_p,
                                local_310.field_2._M_allocated_capacity + 1);
              }
              if (local_2e8[0] != local_2d8) {
                operator_delete(local_2e8[0],local_2d8[0] + 1);
              }
            }
            ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_258);
            ::std::ios_base::~ios_base(local_1e8);
            iVar6 = 1;
            goto LAB_00209b8a;
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_338._8_8_ != &aStack_320) {
          operator_delete((void *)local_338._8_8_,aStack_320._M_allocated_capacity + 1);
        }
        if (bVar5) {
          local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_b8,*(long *)(p_Var11 + 1),
                     (long)&(p_Var11[1]._M_parent)->_M_color + *(long *)(p_Var11 + 1));
          local_258._0_8_ = &local_248;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)local_258,"inputs:radius","");
          psVar14 = (string *)local_258;
          anon_unknown_0::ParseTypedAttribute<float>
                    ((ParseResult *)local_338,
                     (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&local_2b0,&local_b8,prop,(string *)local_258,local_270);
          if ((code **)local_258._0_8_ != &local_248) {
            operator_delete((void *)local_258._0_8_,(ulong)((long)local_248 + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
            operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
          }
          iVar6 = 0;
          if ((local_338._0_8_ & 0xfffffffd) == 0) {
            iVar6 = 3;
LAB_00209e83:
            bVar5 = false;
          }
          else {
            bVar5 = true;
            if (local_338._0_4_ != Unmatched) {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_258);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_258,"[error]",7)
              ;
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_258,
                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                         ,0x5a);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_258,":",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_258,"ReconstructPrim",0xf);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_258,"():",3);
              poVar7 = (ostream *)::std::ostream::operator<<((string *)local_258,0xcfc);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
              local_2e8[0] = local_2d8;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_2e8,"Parsing attribute `{}` failed. Error: {}","");
              fmt::format<char[14],std::__cxx11::string>
                        (&local_310,(fmt *)local_2e8,(string *)"inputs:radius",
                         (char (*) [14])(local_338 + 8),psVar14);
              poVar7 = ::std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)local_258,local_310._M_dataplus._M_p,
                                  local_310._M_string_length);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
              paVar3 = &local_310.field_2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_310._M_dataplus._M_p != paVar3) {
                operator_delete(local_310._M_dataplus._M_p,
                                local_310.field_2._M_allocated_capacity + 1);
              }
              if (local_2e8[0] != local_2d8) {
                operator_delete(local_2e8[0],local_2d8[0] + 1);
              }
              if (err != (string *)0x0) {
                ::std::__cxx11::stringbuf::str();
                plVar8 = (long *)::std::__cxx11::string::_M_append
                                           ((char *)local_2e8,(ulong)(err->_M_dataplus)._M_p);
                psVar1 = (size_type *)(plVar8 + 2);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar8 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)psVar1) {
                  local_310.field_2._M_allocated_capacity = *psVar1;
                  local_310.field_2._8_8_ = plVar8[3];
                  local_310._M_dataplus._M_p = (pointer)paVar3;
                }
                else {
                  local_310.field_2._M_allocated_capacity = *psVar1;
                  local_310._M_dataplus._M_p = (pointer)*plVar8;
                }
                local_310._M_string_length = plVar8[1];
                *plVar8 = (long)psVar1;
                plVar8[1] = 0;
                *(undefined1 *)(plVar8 + 2) = 0;
                ::std::__cxx11::string::operator=((string *)err,(string *)&local_310);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_310._M_dataplus._M_p != paVar3) {
                  operator_delete(local_310._M_dataplus._M_p,
                                  local_310.field_2._M_allocated_capacity + 1);
                }
                if (local_2e8[0] != local_2d8) {
                  operator_delete(local_2e8[0],local_2d8[0] + 1);
                }
              }
              ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_258);
              ::std::ios_base::~ios_base(local_1e8);
              iVar6 = 1;
              goto LAB_00209e83;
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_338._8_8_ != &aStack_320) {
            operator_delete((void *)local_338._8_8_,aStack_320._M_allocated_capacity + 1);
          }
          if (bVar5) {
            local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
            ::std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_d8,*(long *)(p_Var11 + 1),
                       (long)&(p_Var11[1]._M_parent)->_M_color + *(long *)(p_Var11 + 1));
            local_258._0_8_ = &local_248;
            ::std::__cxx11::string::_M_construct<char_const*>((string *)local_258,"extent","");
            args = prop;
            anon_unknown_0::ParseExtentAttribute
                      ((ParseResult *)local_338,
                       (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&local_2b0,&local_d8,prop,(string *)local_258,local_278);
            if ((code **)local_258._0_8_ != &local_248) {
              operator_delete((void *)local_258._0_8_,(ulong)((long)local_248 + 1));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
              operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
            }
            iVar6 = 0;
            if ((local_338._0_8_ & 0xfffffffd) == 0) {
              iVar6 = 3;
LAB_0020a175:
              bVar5 = false;
            }
            else {
              bVar5 = true;
              if (local_338._0_4_ != Unmatched) {
                ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_258);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_258,"[error]",7);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_258,
                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                           ,0x5a);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_258,":",1);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_258,"ReconstructPrim",0xf);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_258,"():",3);
                poVar7 = (ostream *)::std::ostream::operator<<((string *)local_258,0xcfd);
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
                local_2e8[0] = local_2d8;
                ::std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_2e8,"Parsing attribute `extent` failed. Error: {}","");
                fmt::format<std::__cxx11::string>
                          ((string *)&local_310,(fmt *)local_2e8,(string *)(local_338 + 8),
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args
                          );
                poVar7 = ::std::__ostream_insert<char,std::char_traits<char>>
                                   ((ostream *)local_258,local_310._M_dataplus._M_p,
                                    local_310._M_string_length);
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
                paVar3 = &local_310.field_2;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_310._M_dataplus._M_p != paVar3) {
                  operator_delete(local_310._M_dataplus._M_p,
                                  local_310.field_2._M_allocated_capacity + 1);
                }
                if (local_2e8[0] != local_2d8) {
                  operator_delete(local_2e8[0],local_2d8[0] + 1);
                }
                if (err != (string *)0x0) {
                  ::std::__cxx11::stringbuf::str();
                  plVar8 = (long *)::std::__cxx11::string::_M_append
                                             ((char *)local_2e8,(ulong)(err->_M_dataplus)._M_p);
                  psVar1 = (size_type *)(plVar8 + 2);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*plVar8 ==
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)psVar1) {
                    local_310.field_2._M_allocated_capacity = *psVar1;
                    local_310.field_2._8_8_ = plVar8[3];
                    local_310._M_dataplus._M_p = (pointer)paVar3;
                  }
                  else {
                    local_310.field_2._M_allocated_capacity = *psVar1;
                    local_310._M_dataplus._M_p = (pointer)*plVar8;
                  }
                  local_310._M_string_length = plVar8[1];
                  *plVar8 = (long)psVar1;
                  plVar8[1] = 0;
                  *(undefined1 *)(plVar8 + 2) = 0;
                  ::std::__cxx11::string::operator=((string *)err,(string *)&local_310);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_310._M_dataplus._M_p != paVar3) {
                    operator_delete(local_310._M_dataplus._M_p,
                                    local_310.field_2._M_allocated_capacity + 1);
                  }
                  if (local_2e8[0] != local_2d8) {
                    operator_delete(local_2e8[0],local_2d8[0] + 1);
                  }
                }
                ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_258);
                ::std::ios_base::~ios_base(local_1e8);
                iVar6 = 1;
                goto LAB_0020a175;
              }
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_338._8_8_ != &aStack_320) {
              operator_delete((void *)local_338._8_8_,aStack_320._M_allocated_capacity + 1);
            }
            if (bVar5) {
              __k = p_Var11 + 1;
              iVar6 = ::std::__cxx11::string::compare((char *)__k);
              if (iVar6 == 0) {
                local_258._0_8_ = &local_248;
                ::std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_258,"visibility","");
                cVar9 = ::std::
                        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::find(&local_2b0,(string *)local_258);
                if ((code **)local_258._0_8_ != &local_248) {
                  operator_delete((void *)local_258._0_8_,(ulong)((long)local_248 + 1));
                }
                iVar6 = 3;
                if ((_Rb_tree_header *)cVar9._M_node == &local_2b0._M_impl.super__Rb_tree_header) {
                  if (((ulong)p_Var11[0x17]._M_parent & 0xfffffffe00000000) == 0x200000000) {
                    local_258._0_8_ = &local_248;
                    local_258._8_8_ = 0;
                    local_248 = (code *)((ulong)local_248 & 0xffffffffffffff00);
                  }
                  else {
                    Attribute::type_name_abi_cxx11_((string *)local_258,(Attribute *)prop);
                  }
                  local_338._0_8_ = local_338 + 0x10;
                  local_338._8_8_ =
                       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)0x5;
                  local_338._16_6_ = 0x6e656b6f74;
                  if (((local_258._8_8_ == 5) &&
                      (iVar6 = bcmp((void *)local_258._0_8_,local_338 + 0x10,5), iVar6 == 0)) &&
                     (uVar4 = *(uint *)((long)&p_Var11[0x17]._M_parent + 4), uVar4 < 2)) {
                    if ((code **)local_258._0_8_ != &local_248) {
                      operator_delete((void *)local_258._0_8_,(ulong)((long)local_248 + 1));
                    }
                    if (uVar4 == 0) {
                      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_258);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_258,"[warn]",6);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_258,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                 ,0x5a);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_258,":",1);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_258,"ReconstructPrim",0xf);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_258,"():",3);
                      poVar7 = (ostream *)::std::ostream::operator<<((string *)local_258,0xcff);
                      ::std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_258,"No value assigned to `",0x16);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_258,"visibility",10);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_258,"` token attribute. Set default token value.",
                                 0x2b);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_258,"\n",1);
                      if (local_2f0 != (string *)0x0) {
                        ::std::__cxx11::stringbuf::str();
                        ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)local_338,&local_310,err);
                        ::std::__cxx11::string::operator=((string *)local_2f0,(string *)local_338);
                        if ((undefined1 *)local_338._0_8_ != local_338 + 0x10) {
                          operator_delete((void *)local_338._0_8_,local_338._16_8_ + 1);
                        }
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_310._M_dataplus._M_p != &local_310.field_2) {
                          operator_delete(local_310._M_dataplus._M_p,
                                          local_310.field_2._M_allocated_capacity + 1);
                        }
                      }
                      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_258);
                      ::std::ios_base::~ios_base(local_1e8);
                      AttrMetas::operator=(&local_2c0->_metas,(AttrMetas *)(p_Var11 + 7));
                      pcVar13 = "visibility";
                      pcVar12 = "";
LAB_0020abba:
                      iVar6 = 3;
                      local_258._0_8_ = &local_248;
                      ::std::__cxx11::string::_M_construct<char_const*>
                                ((string *)local_258,pcVar13,pcVar12);
                      ::std::
                      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      ::_M_insert_unique<std::__cxx11::string>
                                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                                  *)&local_2b0,(string *)local_258);
                      if ((code **)local_258._0_8_ != &local_248) {
                        operator_delete((void *)local_258._0_8_,(ulong)((long)local_248 + 1));
                      }
                      goto LAB_0020ae36;
                    }
                  }
                  else if ((code **)local_258._0_8_ != &local_248) {
                    operator_delete((void *)local_258._0_8_,(ulong)((long)local_248 + 1));
                  }
                  local_258._8_8_ = 0;
                  local_258._0_8_ = VisibilityEnumHandler;
                  pcStack_240 = ::std::
                                _Function_handler<nonstd::expected_lite::expected<tinyusdz::Visibility,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_nonstd::expected_lite::expected<tinyusdz::Visibility,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                                ::_M_invoke;
                  local_248 = ::std::
                              _Function_handler<nonstd::expected_lite::expected<tinyusdz::Visibility,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_nonstd::expected_lite::expected<tinyusdz::Visibility,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                              ::_M_manager;
                  local_338._0_8_ = local_338 + 0x10;
                  ::std::__cxx11::string::_M_construct<char_const*>
                            ((string *)local_338,"visibility","");
                  bVar5 = options->strict_allowedToken_check;
                  local_48 = (code *)0x0;
                  pcStack_40 = (code *)0x0;
                  local_58._M_unused._M_object = (void *)0x0;
                  local_58._8_8_ = 0;
                  if (local_248 != (code *)0x0) {
                    (*local_248)(&local_58,(string *)local_258,2);
                    local_48 = local_248;
                    pcStack_40 = pcStack_240;
                  }
                  bVar5 = ParseTimeSampledEnumProperty<tinyusdz::Visibility,tinyusdz::Visibility>
                                    ((string *)local_338,bVar5,
                                     (EnumHandlerFun<tinyusdz::Visibility> *)&local_58,
                                     (Attribute *)prop,local_2c0,local_2f0,err);
                  if (local_48 != (code *)0x0) {
                    (*local_48)(&local_58,&local_58,__destroy_functor);
                  }
                  if ((undefined1 *)local_338._0_8_ != local_338 + 0x10) {
                    operator_delete((void *)local_338._0_8_,local_338._16_8_ + 1);
                  }
                  iVar6 = 1;
                  if (bVar5) {
                    AttrMetas::operator=(&local_2c0->_metas,(AttrMetas *)(p_Var11 + 7));
                    pcVar13 = "visibility";
                    pcVar12 = "";
LAB_0020ad68:
                    local_338._0_8_ = local_338 + 0x10;
                    ::std::__cxx11::string::_M_construct<char_const*>
                              ((string *)local_338,pcVar13,pcVar12);
                    ::std::
                    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    ::_M_insert_unique<std::__cxx11::string>
                              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                                *)&local_2b0,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_338);
                    if ((undefined1 *)local_338._0_8_ != local_338 + 0x10) {
                      operator_delete((void *)local_338._0_8_,local_338._16_8_ + 1);
                    }
                    iVar6 = 3;
                  }
LAB_0020ad9a:
                  if (local_248 != (code *)0x0) {
                    (*local_248)((string *)local_258,(string *)local_258,3);
                  }
                }
              }
              else {
                iVar6 = ::std::__cxx11::string::compare((char *)__k);
                if (iVar6 == 0) {
                  local_258._0_8_ = &local_248;
                  ::std::__cxx11::string::_M_construct<char_const*>
                            ((string *)local_258,"purpose","");
                  cVar9 = ::std::
                          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::find(&local_2b0,(string *)local_258);
                  if ((code **)local_258._0_8_ != &local_248) {
                    operator_delete((void *)local_258._0_8_,(ulong)((long)local_248 + 1));
                  }
                  iVar6 = 3;
                  if ((_Rb_tree_header *)cVar9._M_node == &local_2b0._M_impl.super__Rb_tree_header)
                  {
                    if (((ulong)p_Var11[0x17]._M_parent & 0xfffffffe00000000) == 0x200000000) {
                      local_258._0_8_ = &local_248;
                      local_258._8_8_ = 0;
                      local_248 = (code *)((ulong)local_248 & 0xffffffffffffff00);
                    }
                    else {
                      Attribute::type_name_abi_cxx11_((string *)local_258,(Attribute *)prop);
                    }
                    local_338._0_8_ = local_338 + 0x10;
                    local_338._8_8_ =
                         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)0x5;
                    local_338._16_6_ = 0x6e656b6f74;
                    if (((local_258._8_8_ == 5) &&
                        (iVar6 = bcmp((void *)local_258._0_8_,local_338 + 0x10,5), iVar6 == 0)) &&
                       (uVar4 = *(uint *)((long)&p_Var11[0x17]._M_parent + 4), uVar4 < 2)) {
                      if ((code **)local_258._0_8_ != &local_248) {
                        operator_delete((void *)local_258._0_8_,(ulong)((long)local_248 + 1));
                      }
                      if (uVar4 == 0) {
                        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_258);
                        ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_258,"[warn]",6);
                        ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_258,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                   ,0x5a);
                        ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_258,":",1);
                        ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_258,"ReconstructPrim",0xf);
                        ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_258,"():",3);
                        poVar7 = (ostream *)::std::ostream::operator<<((string *)local_258,0xd01);
                        ::std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
                        ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_258,"No value assigned to `",0x16);
                        ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_258,"purpose",7);
                        ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_258,
                                   "` token attribute. Set default token value.",0x2b);
                        ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_258,"\n",1);
                        if (local_2f0 != (string *)0x0) {
                          ::std::__cxx11::stringbuf::str();
                          ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)local_338,&local_310,err);
                          ::std::__cxx11::string::operator=((string *)local_2f0,(string *)local_338)
                          ;
                          if ((undefined1 *)local_338._0_8_ != local_338 + 0x10) {
                            operator_delete((void *)local_338._0_8_,local_338._16_8_ + 1);
                          }
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_310._M_dataplus._M_p != &local_310.field_2) {
                            operator_delete(local_310._M_dataplus._M_p,
                                            local_310.field_2._M_allocated_capacity + 1);
                          }
                        }
                        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_258);
                        ::std::ios_base::~ios_base(local_1e8);
                        AttrMetas::operator=(&local_2c8->_metas,(AttrMetas *)(p_Var11 + 7));
                        pcVar13 = "purpose";
                        pcVar12 = "";
                        goto LAB_0020abba;
                      }
                    }
                    else if ((code **)local_258._0_8_ != &local_248) {
                      operator_delete((void *)local_258._0_8_,(ulong)((long)local_248 + 1));
                    }
                    local_258._8_8_ = 0;
                    local_258._0_8_ = PurposeEnumHandler;
                    pcStack_240 = ::std::
                                  _Function_handler<nonstd::expected_lite::expected<tinyusdz::Purpose,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_nonstd::expected_lite::expected<tinyusdz::Purpose,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                                  ::_M_invoke;
                    local_248 = ::std::
                                _Function_handler<nonstd::expected_lite::expected<tinyusdz::Purpose,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_nonstd::expected_lite::expected<tinyusdz::Purpose,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                                ::_M_manager;
                    local_338._0_8_ = local_338 + 0x10;
                    ::std::__cxx11::string::_M_construct<char_const*>
                              ((string *)local_338,"purpose","");
                    bVar5 = options->strict_allowedToken_check;
                    local_68 = (code *)0x0;
                    pcStack_60 = (code *)0x0;
                    local_78._M_unused._M_object = (void *)0x0;
                    local_78._8_8_ = 0;
                    if (local_248 != (code *)0x0) {
                      (*local_248)(&local_78,(string *)local_258,2);
                      local_68 = local_248;
                      pcStack_60 = pcStack_240;
                    }
                    bVar5 = ParseUniformEnumProperty<tinyusdz::Purpose,tinyusdz::Purpose>
                                      ((string *)local_338,bVar5,
                                       (EnumHandlerFun<tinyusdz::Purpose> *)&local_78,
                                       (Attribute *)prop,local_2c8,local_2f0,err);
                    if (local_68 != (code *)0x0) {
                      (*local_68)(&local_78,&local_78,__destroy_functor);
                    }
                    if ((undefined1 *)local_338._0_8_ != local_338 + 0x10) {
                      operator_delete((void *)local_338._0_8_,local_338._16_8_ + 1);
                    }
                    iVar6 = 1;
                    if (bVar5) {
                      AttrMetas::operator=(&local_2c8->_metas,(AttrMetas *)(p_Var11 + 7));
                      pcVar13 = "purpose";
                      pcVar12 = "";
                      goto LAB_0020ad68;
                    }
                    goto LAB_0020ad9a;
                  }
                }
                else {
                  cVar9 = ::std::
                          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::find(&local_2b0,(key_type *)__k);
                  if ((_Rb_tree_header *)cVar9._M_node == &local_2b0._M_impl.super__Rb_tree_header)
                  {
                    pmVar10 = ::std::
                              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                              ::operator[](local_280,(key_type *)__k);
                    ::std::__cxx11::string::_M_assign((string *)pmVar10);
                    (pmVar10->_attrib)._varying_authored = (bool)p_Var11[3].field_0x4;
                    (pmVar10->_attrib)._variability = p_Var11[3]._M_color;
                    ::std::__cxx11::string::_M_assign((string *)&(pmVar10->_attrib)._type_name);
                    linb::any::operator=
                              ((any *)&(pmVar10->_attrib)._var,(any *)&p_Var11[4]._M_parent);
                    (pmVar10->_attrib)._var._blocked = SUB41(p_Var11[5]._M_color,0);
                    ::std::
                    vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                    ::operator=((vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                                 *)&(pmVar10->_attrib)._var._ts,
                                (vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                                 *)&p_Var11[5]._M_parent);
                    (pmVar10->_attrib)._var._ts._dirty = SUB41(p_Var11[6]._M_color,0);
                    std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                              (&(pmVar10->_attrib)._paths,
                               (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                               &p_Var11[6]._M_parent);
                    AttrMetas::operator=(&(pmVar10->_attrib)._metas,(AttrMetas *)(p_Var11 + 7));
                    *(_Base_ptr *)&pmVar10->_listOpQual = p_Var11[0x17]._M_parent;
                    (pmVar10->_rel).type = *(Type *)&p_Var11[0x17]._M_left;
                    Path::operator=(&(pmVar10->_rel).targetPath,(Path *)&p_Var11[0x17]._M_right);
                    std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                              (&(pmVar10->_rel).targetPathVector,
                               (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                               &p_Var11[0x1e]._M_parent);
                    (pmVar10->_rel).listOpQual = p_Var11[0x1f]._M_color;
                    AttrMetas::operator=
                              (&(pmVar10->_rel)._metas,(AttrMetas *)&p_Var11[0x1f]._M_parent);
                    (pmVar10->_rel)._varying_authored = *(bool *)&p_Var11[0x2f]._M_left;
                    ::std::__cxx11::string::_M_assign((string *)&pmVar10->_prop_value_type_name);
                    pmVar10->_has_custom = *(bool *)&p_Var11[0x30]._M_right;
                    ::std::
                    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    ::_M_insert_unique<std::__cxx11::string_const&>
                              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                                *)&local_2b0,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               __k);
                  }
                  cVar9 = ::std::
                          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::find(&local_2b0,(key_type *)__k);
                  iVar6 = 0;
                  if ((_Rb_tree_header *)cVar9._M_node == &local_2b0._M_impl.super__Rb_tree_header)
                  {
                    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_258);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_258,"[warn]",6);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_258,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                               ,0x5a);
                    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_258,":",1)
                    ;
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_258,"ReconstructPrim",0xf);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_258,"():",3);
                    poVar7 = (ostream *)::std::ostream::operator<<((string *)local_258,0xd03);
                    ::std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
                    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_338,"Unsupported/unimplemented property: ",
                                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)__k);
                    poVar7 = ::std::__ostream_insert<char,std::char_traits<char>>
                                       ((ostream *)local_258,(char *)local_338._0_8_,local_338._8_8_
                                       );
                    ::std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
                    psVar1 = (size_type *)(local_338 + 0x10);
                    if ((size_type *)local_338._0_8_ != psVar1) {
                      operator_delete((void *)local_338._0_8_,local_338._16_8_ + 1);
                    }
                    if (local_2f0 != (string *)0x0) {
                      ::std::__cxx11::stringbuf::str();
                      plVar8 = (long *)::std::__cxx11::string::_M_append
                                                 ((char *)&local_310,(ulong)(err->_M_dataplus)._M_p)
                      ;
                      psVar2 = (size_type *)(plVar8 + 2);
                      if ((size_type *)*plVar8 == psVar2) {
                        local_338._16_8_ = *psVar2;
                        aStack_320._M_allocated_capacity = plVar8[3];
                        local_338._0_8_ = psVar1;
                      }
                      else {
                        local_338._16_8_ = *psVar2;
                        local_338._0_8_ = (size_type *)*plVar8;
                      }
                      local_338._8_8_ = plVar8[1];
                      *plVar8 = (long)psVar2;
                      plVar8[1] = 0;
                      *(undefined1 *)(plVar8 + 2) = 0;
                      ::std::__cxx11::string::operator=((string *)local_2f0,(string *)local_338);
                      if ((size_type *)local_338._0_8_ != psVar1) {
                        operator_delete((void *)local_338._0_8_,local_338._16_8_ + 1);
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_310._M_dataplus._M_p != &local_310.field_2) {
                        operator_delete(local_310._M_dataplus._M_p,
                                        local_310.field_2._M_allocated_capacity + 1);
                      }
                    }
                    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_258);
                    ::std::ios_base::~ios_base(local_1e8);
                  }
                }
              }
            }
          }
        }
LAB_0020ae36:
        if ((iVar6 != 3) && (iVar6 != 0)) break;
        p_Var11 = (_Rb_tree_node_base *)::std::_Rb_tree_increment(p_Var11);
        local_2b8 = CONCAT71((int7)((ulong)p_Var11 >> 8),p_Var11 == local_260);
      } while (p_Var11 != local_260);
    }
  }
  ::std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase(&local_2b0,(_Link_type)local_2b0._M_impl.super__Rb_tree_header._M_header._M_parent);
  return (bool)((byte)local_2b8 & 1);
}

Assistant:

bool ReconstructPrim<CylinderLight>(
    const Specifier &spec,
    const PropertyMap &properties,
    const ReferenceList &references,
    CylinderLight *light,
    std::string *warn,
    std::string *err,
    const PrimReconstructOptions &options) {

  (void)references;
  (void)options;

  std::set<std::string> table;

  if (!prim::ReconstructXformOpsFromProperties(spec, table, properties, &light->xformOps, err)) {
    return false;
  }

  for (const auto &prop : properties) {
    // PARSE_PROPERTY(prop, "inputs:colorTemperature", light->colorTemperature)
    PARSE_TYPED_ATTRIBUTE(table, prop, "inputs:length", CylinderLight, light->length)
    PARSE_TYPED_ATTRIBUTE(table, prop, "inputs:radius", CylinderLight, light->radius)
    PARSE_EXTENT_ATTRIBUTE(table, prop, kExtent, CylinderLight, light->extent)
    PARSE_TIMESAMPLED_ENUM_PROPERTY(table, prop, kVisibility, Visibility, VisibilityEnumHandler, CylindrLight,
                   light->visibility, options.strict_allowedToken_check)
    PARSE_UNIFORM_ENUM_PROPERTY(table, prop, kPurpose, Purpose, PurposeEnumHandler, CylinderLight,
                       light->purpose, options.strict_allowedToken_check)
    ADD_PROPERTY(table, prop, SphereLight, light->props)
    PARSE_PROPERTY_END_MAKE_WARN(table, prop)
  }

  return true;
}